

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerCPP::emit_buffer_block(CompilerCPP *this,SPIRVariable *var)

{
  ID *__k;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  uint32_t uVar1;
  SPIRType *pSVar2;
  mapped_type *pmVar3;
  SPIRType *type;
  char (*ts_7) [3];
  uint32_t binding;
  uint32_t descriptor_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string instance_name;
  string buffer_name;
  
  __k = &(var->super_IVariant).self;
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&instance_name,this,(ulong)(var->super_IVariant).self.id,1);
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  descriptor_set = (pmVar3->decoration).set;
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  binding = (pmVar3->decoration).binding;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr + (pSVar2->super_IVariant).self.id);
  (type->type_alias).id = 0;
  CompilerGLSL::emit_struct(&this->super_CompilerGLSL,type);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&buffer_name,this,(ulong)(pSVar2->super_IVariant).self.id,1);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_88,this,pSVar2);
  CompilerGLSL::
  statement<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [20])"internal::Resource<",&buffer_name,&local_88,
             (char (*) [3])0x365527,&instance_name,(char (*) [4])"__;");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  uVar1 = (this->super_CompilerGLSL).indent;
  (this->super_CompilerGLSL).indent = 0;
  ts_7 = (char (*) [3])0x291daa;
  CompilerGLSL::
  statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
            (&this->super_CompilerGLSL,(char (*) [9])"#define ",&instance_name,
             (char (*) [9])" __res->",&instance_name,(char (*) [9])"__.get()");
  (this->super_CompilerGLSL).indent = uVar1;
  join<char_const(&)[21],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
            (&local_88,(spirv_cross *)"s.register_resource(",(char (*) [21])&instance_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3718b6,
             (char (*) [3])0x37aab7,(char (*) [3])&descriptor_set,(uint *)0x37aab7,
             (char (*) [3])&binding,(uint *)0x365573,ts_7);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(&this->resource_registrations,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x35b140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer_name._M_dataplus._M_p != &buffer_name.field_2) {
    operator_delete(buffer_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)instance_name._M_dataplus._M_p != &instance_name.field_2) {
    operator_delete(instance_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerCPP::emit_buffer_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto instance_name = to_name(var.self);

	uint32_t descriptor_set = ir.meta[var.self].decoration.set;
	uint32_t binding = ir.meta[var.self].decoration.binding;

	emit_block_struct(type);
	auto buffer_name = to_name(type.self);

	statement("internal::Resource<", buffer_name, type_to_array_glsl(type), "> ", instance_name, "__;");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
	resource_registrations.push_back(
	    join("s.register_resource(", instance_name, "__", ", ", descriptor_set, ", ", binding, ");"));
	statement("");
}